

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
CMU462::DynamicScene::XFormWidget::setSelection(XFormWidget *this,int pickID,Selection *selection)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  key_type_conflict local_14;
  
  p_Var1 = &(this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < pickID]) {
    if (pickID <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, pickID < (int)p_Var4[1]._M_color))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    (this->target).axis = None;
  }
  else {
    selection->object = (SceneObject *)0x0;
    selection->element = (HalfedgeElement *)0x0;
    (selection->coordinates).x = 0.0;
    (selection->coordinates).y = 0.0;
    (selection->coordinates).z = 0.0;
    selection->axis = None;
    selection->object = &this->super_SceneObject;
    selection->element = (HalfedgeElement *)0x0;
    pmVar3 = std::
             map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
             ::operator[](&this->pickIDToAxis,&local_14);
    mVar2 = *pmVar3;
    (this->target).axis = mVar2;
    selection->axis = mVar2;
  }
  return;
}

Assistant:

void XFormWidget::setSelection( int pickID, Selection& selection )
{
   if( pickIDToAxis.find(pickID) != pickIDToAxis.end() )
   {
      selection.clear();
      selection.object = this;
      selection.element = nullptr;
      selection.axis = target.axis = pickIDToAxis[pickID];
   }
   else
   {
      target.axis = Selection::Axis::None;
   }
}